

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O3

ScalarFunction * duckdb::GetLeastGreatestFunction<duckdb::LeastOp>(void)

{
  LogicalType varargs;
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff4c;
  FunctionNullHandling in_stack_ffffffffffffff58;
  bind_lambda_function_t in_stack_ffffffffffffff60;
  _Any_data local_98;
  code *local_88;
  undefined8 uStack_80;
  LogicalType local_70;
  vector<duckdb::LogicalType,_true> local_58;
  LogicalType local_40;
  LogicalType local_28;
  
  LogicalType::LogicalType(&local_28,ANY);
  __l._M_len = 1;
  __l._M_array = &local_28;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_58,__l,
             (allocator_type *)&stack0xffffffffffffff67);
  LogicalType::LogicalType(&local_70,ANY);
  local_88 = (code *)0x0;
  uStack_80 = 0;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  LogicalType::LogicalType(&local_40,ANY);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_40;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_ffffffffffffff44;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 1;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_ffffffffffffff4c;
  ScalarFunction::ScalarFunction
            (in_RDI,&local_58,&local_70,(scalar_function_t *)&local_98,
             BindLeastGreatest<duckdb::LeastOp>,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_ffffffffffffff58,in_stack_ffffffffffffff60);
  LogicalType::~LogicalType(&local_40);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_70);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_58);
  LogicalType::~LogicalType(&local_28);
  return in_RDI;
}

Assistant:

ScalarFunction GetLeastGreatestFunction() {
	return ScalarFunction({LogicalType::ANY}, LogicalType::ANY, nullptr, BindLeastGreatest<OP>, nullptr, nullptr,
	                      nullptr, LogicalType::ANY, FunctionStability::CONSISTENT,
	                      FunctionNullHandling::SPECIAL_HANDLING);
}